

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_huffman_init(huffman *hf,size_t len_size,wchar_t tbl_bits)

{
  uchar *puVar1;
  uint16_t *puVar2;
  wchar_t tbl_bits_local;
  size_t len_size_local;
  huffman *hf_local;
  
  if ((hf->bitlen == (uchar *)0x0) || (hf->len_size != (wchar_t)len_size)) {
    free(hf->bitlen);
    puVar1 = (uchar *)calloc(len_size,1);
    hf->bitlen = puVar1;
    if (hf->bitlen == (uchar *)0x0) {
      return L'\xffffffe2';
    }
    hf->len_size = (wchar_t)len_size;
  }
  else {
    memset(hf->bitlen,0,len_size);
  }
  if (hf->tbl == (uint16_t *)0x0) {
    puVar2 = (uint16_t *)malloc((1L << ((byte)tbl_bits & 0x3f)) << 1);
    hf->tbl = puVar2;
    if (hf->tbl == (uint16_t *)0x0) {
      return L'\xffffffe2';
    }
    hf->tbl_bits = tbl_bits;
  }
  return L'\0';
}

Assistant:

static int
lzx_huffman_init(struct huffman *hf, size_t len_size, int tbl_bits)
{

	if (hf->bitlen == NULL || hf->len_size != (int)len_size) {
		free(hf->bitlen);
		hf->bitlen = calloc(len_size,  sizeof(hf->bitlen[0]));
		if (hf->bitlen == NULL)
			return (ARCHIVE_FATAL);
		hf->len_size = (int)len_size;
	} else
		memset(hf->bitlen, 0, len_size *  sizeof(hf->bitlen[0]));
	if (hf->tbl == NULL) {
		hf->tbl = malloc(((size_t)1 << tbl_bits) * sizeof(hf->tbl[0]));
		if (hf->tbl == NULL)
			return (ARCHIVE_FATAL);
		hf->tbl_bits = tbl_bits;
	}
	return (ARCHIVE_OK);
}